

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

void Fx_ManComputeLevel(Fx_Man_t *p)

{
  Vec_Int_t *p_00;
  int i;
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int i_00;
  int iVar4;
  
  pVVar3 = Vec_WecEntry(p->vCubes,0);
  i = Vec_IntEntry(pVVar3,0);
  pVVar3 = Vec_IntStart(p->nVars);
  p->vLevels = pVVar3;
  iVar4 = 0;
  for (i_00 = 0; i_00 < p->vCubes->nSize; i_00 = i_00 + 1) {
    pVVar3 = Vec_WecEntry(p->vCubes,i_00);
    iVar1 = Vec_IntEntry(pVVar3,0);
    if (i != iVar1) {
      Vec_IntAddToEntry(p->vLevels,i,i_00 - iVar4);
      i = Vec_IntEntry(pVVar3,0);
      iVar4 = i_00;
    }
    p_00 = p->vLevels;
    iVar1 = Fx_ManComputeLevelCube(p,pVVar3);
    iVar2 = Vec_IntEntry(p_00,i);
    if (iVar2 < iVar1) {
      Vec_IntWriteEntry(p_00,i,iVar1);
    }
  }
  return;
}

Assistant:

void Fx_ManComputeLevel( Fx_Man_t * p )
{
    Vec_Int_t * vCube;
    int i, iVar, iFirst = 0;
    iVar = Vec_IntEntry( Vec_WecEntry(p->vCubes,0), 0 );
    p->vLevels = Vec_IntStart( p->nVars );
    Vec_WecForEachLevel( p->vCubes, vCube, i )
    {
        if ( iVar != Vec_IntEntry(vCube, 0) )
        {
            // add the number of cubes
            Vec_IntAddToEntry( p->vLevels, iVar, i - iFirst );
            iVar = Vec_IntEntry(vCube, 0);
            iFirst = i;
        }
        Vec_IntUpdateEntry( p->vLevels, iVar, Fx_ManComputeLevelCube(p, vCube) );
    }
}